

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BeginRenderPass
          (VulkanCommandBuffer *this,VkRenderPass RenderPass,VkFramebuffer Framebuffer,
          uint32_t FramebufferWidth,uint32_t FramebufferHeight,uint32_t ClearValueCount,
          VkClearValue *pClearValues)

{
  Char *pCVar1;
  undefined4 in_register_0000000c;
  undefined1 local_e0 [8];
  VkRenderPassBeginInfo BeginInfo;
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  uint32_t ClearValueCount_local;
  uint32_t FramebufferHeight_local;
  uint32_t FramebufferWidth_local;
  VkFramebuffer Framebuffer_local;
  VkRenderPass RenderPass_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._12_4_ = ClearValueCount;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,FramebufferWidth));
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x128);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((this->m_State).RenderPass != (VkRenderPass)0x0) {
    Diligent::FormatString<char[32]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [32])"Current pass has not been ended"
              );
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x129);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).DynamicRenderingHash != 0) {
    Diligent::FormatString<char[47]>
              ((string *)&BeginInfo.pClearValues,
               (char (*) [47])"Current dynamic render pass has not been ended");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x12a);
    std::__cxx11::string::~string((string *)&BeginInfo.pClearValues);
  }
  if (((this->m_State).RenderPass != RenderPass) || ((this->m_State).Framebuffer != Framebuffer)) {
    FlushBarriers(this);
    local_e0._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
    BeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    BeginInfo._4_4_ = 0;
    BeginInfo.framebuffer = (VkFramebuffer)0x0;
    BeginInfo.renderArea.offset.y = FramebufferHeight;
    BeginInfo.renderArea.offset.x = FramebufferWidth;
    BeginInfo.renderArea.extent.width = msg.field_2._12_4_;
    BeginInfo._48_8_ = pClearValues;
    BeginInfo.pNext = RenderPass;
    BeginInfo.renderPass = (VkRenderPass)Framebuffer;
    (*vkCmdBeginRenderPass)
              (this->m_VkCmdBuffer,(VkRenderPassBeginInfo *)local_e0,VK_SUBPASS_CONTENTS_INLINE);
    (this->m_State).RenderPass = RenderPass;
    (this->m_State).Framebuffer = Framebuffer;
    (this->m_State).FramebufferWidth = FramebufferWidth;
    (this->m_State).FramebufferHeight = FramebufferHeight;
  }
  return;
}

Assistant:

__forceinline void BeginRenderPass(VkRenderPass        RenderPass,
                                       VkFramebuffer       Framebuffer,
                                       uint32_t            FramebufferWidth,
                                       uint32_t            FramebufferHeight,
                                       uint32_t            ClearValueCount = 0,
                                       const VkClearValue* pClearValues    = nullptr)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(m_State.RenderPass == VK_NULL_HANDLE, "Current pass has not been ended");
        VERIFY(m_State.DynamicRenderingHash == 0, "Current dynamic render pass has not been ended");

        if (m_State.RenderPass != RenderPass || m_State.Framebuffer != Framebuffer)
        {
            FlushBarriers();

            VkRenderPassBeginInfo BeginInfo;
            BeginInfo.sType       = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
            BeginInfo.pNext       = nullptr;
            BeginInfo.renderPass  = RenderPass;
            BeginInfo.framebuffer = Framebuffer;
            // The render area MUST be contained within the framebuffer dimensions (7.4)
            BeginInfo.renderArea      = {{0, 0}, {FramebufferWidth, FramebufferHeight}};
            BeginInfo.clearValueCount = ClearValueCount;
            BeginInfo.pClearValues    = pClearValues; // an array of VkClearValue structures that contains clear values for
                                                      // each attachment, if the attachment uses a loadOp value of VK_ATTACHMENT_LOAD_OP_CLEAR
                                                      // or if the attachment has a depth/stencil format and uses a stencilLoadOp value of
                                                      // VK_ATTACHMENT_LOAD_OP_CLEAR. The array is indexed by attachment number. Only elements
                                                      // corresponding to cleared attachments are used. Other elements of pClearValues are
                                                      // ignored (7.4)

            vkCmdBeginRenderPass(m_VkCmdBuffer, &BeginInfo,
                                 VK_SUBPASS_CONTENTS_INLINE // the contents of the subpass will be recorded inline in the
                                                            // primary command buffer, and secondary command buffers must not
                                                            // be executed within the subpass
            );
            m_State.RenderPass        = RenderPass;
            m_State.Framebuffer       = Framebuffer;
            m_State.FramebufferWidth  = FramebufferWidth;
            m_State.FramebufferHeight = FramebufferHeight;
        }
    }